

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O2

void __thiscall xercesc_4_0::CMStateSet::setBit(CMStateSet *this,XMLSize_t bitToSet)

{
  CMDynamicBuffer *pCVar1;
  ArrayIndexOutOfBoundsException *this_00;
  XMLSize_t index;
  long lVar2;
  XMLInt32 *pXVar3;
  ulong index_00;
  
  pCVar1 = this->fDynamicBuffer;
  if (bitToSet < this->fBitCount) {
    if (pCVar1 == (CMDynamicBuffer *)0x0) {
      pXVar3 = this->fBits + (bitToSet >> 5);
    }
    else {
      index_00 = bitToSet >> 10;
      pXVar3 = pCVar1->fBitArray[index_00];
      if (pXVar3 == (XMLInt32 *)0x0) {
        allocateChunk(this,index_00);
        pXVar3 = this->fDynamicBuffer->fBitArray[index_00];
        for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
          pXVar3[lVar2] = 0;
        }
      }
      pXVar3 = (XMLInt32 *)((ulong)((uint)(bitToSet >> 3) & 0x7c) + (long)pXVar3);
    }
    *pXVar3 = *pXVar3 | 1 << ((byte)bitToSet & 0x1f);
    return;
  }
  this_00 = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
  if (pCVar1 == (CMDynamicBuffer *)0x0) {
    ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
               ,0x1a5,Bitset_BadIndex,(MemoryManager *)0x0);
  }
  else {
    ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
               ,0x1a3,Bitset_BadIndex,this->fDynamicBuffer->fMemoryManager);
  }
  __cxa_throw(this_00,&ArrayIndexOutOfBoundsException::typeinfo,
              xercesc_4_0::XMLException::~XMLException);
}

Assistant:

void setBit(const XMLSize_t bitToSet)
    {
        if (bitToSet >= fBitCount)
        {
            if(fDynamicBuffer)
                ThrowXMLwithMemMgr(ArrayIndexOutOfBoundsException, XMLExcepts::Bitset_BadIndex, fDynamicBuffer->fMemoryManager);
            else
                ThrowXML(ArrayIndexOutOfBoundsException, XMLExcepts::Bitset_BadIndex);
        }

        const XMLInt32 mask = 1UL << (bitToSet % 32);

        // And access the right bit and byte
        if(fDynamicBuffer==0)
        {
            const XMLSize_t byteOfs = bitToSet / 32;
            fBits[byteOfs] &= ~mask;
            fBits[byteOfs] |= mask;
        }
        else
        {
            const XMLSize_t vectorOfs = bitToSet / CMSTATE_BITFIELD_CHUNK;
            if(fDynamicBuffer->fBitArray[vectorOfs]==NULL)
            {
                allocateChunk(vectorOfs);
                for(XMLSize_t index=0;index < CMSTATE_BITFIELD_INT32_SIZE; index++)
                    fDynamicBuffer->fBitArray[vectorOfs][index]=0;
            }
            const XMLSize_t byteOfs = (bitToSet % CMSTATE_BITFIELD_CHUNK) / 32;
            fDynamicBuffer->fBitArray[vectorOfs][byteOfs] &= ~mask;
            fDynamicBuffer->fBitArray[vectorOfs][byteOfs] |= mask;
        }
    }